

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::anon_unknown_6::SetReactionOnUninterestingCalls
               (uintptr_t mock_obj,CallReaction reaction)

{
  mapped_type mVar1;
  unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
  *this;
  mapped_type *pmVar2;
  GTestMutexLock local_20;
  MutexLock l;
  uintptr_t uStack_10;
  CallReaction reaction_local;
  uintptr_t mock_obj_local;
  
  l.mutex_._4_4_ = reaction;
  uStack_10 = mock_obj;
  internal::GTestMutexLock::GTestMutexLock(&local_20,(MutexBase *)internal::g_gmock_mutex);
  mVar1 = l.mutex_._4_4_;
  this = UninterestingCallReactionMap();
  pmVar2 = std::
           unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
           ::operator[](this,&stack0xfffffffffffffff0);
  *pmVar2 = mVar1;
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  UninterestingCallReactionMap()[mock_obj] = reaction;
}